

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_explore_task(Executor *this,Worker *w,Node **t)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  result_type rVar4;
  Node *local_58;
  undefined1 local_48 [8];
  uniform_int_distribution<unsigned_long> rdvtm;
  size_t max_steals;
  size_t num_yields;
  size_t num_steals;
  Node **t_local;
  Worker *w_local;
  Executor *this_local;
  
  num_yields = 0;
  max_steals = 0;
  sVar2 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::size(&this->_workers);
  rdvtm._M_param._M_b = (sVar2 + 1) * 2;
  sVar2 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::size(&this->_workers);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)local_48,0,sVar2 - 1);
  do {
    if (w->_id == w->_vtm) {
      local_58 = TaskQueue<tf::Node_*>::steal(&this->_wsq);
    }
    else {
      pvVar3 = std::vector<tf::Worker,_std::allocator<tf::Worker>_>::operator[]
                         (&this->_workers,w->_vtm);
      local_58 = TaskQueue<tf::Node_*>::steal(&pvVar3->_wsq);
    }
    *t = local_58;
    if (*t != (Node *)0x0) {
      return;
    }
    if (rdvtm._M_param._M_b < num_yields) {
      std::this_thread::yield();
      bVar1 = 100 < max_steals;
      max_steals = max_steals + 1;
      if (bVar1) {
        return;
      }
    }
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)local_48,&w->_rdgen);
    w->_vtm = rVar4;
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->_done);
    num_yields = num_yields + 1;
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

inline void Executor::_explore_task(Worker& w, Node*& t) {

  //assert(_workers[w].wsq.empty());
  //assert(!t);

  size_t num_steals = 0;
  size_t num_yields = 0;
  size_t max_steals = ((_workers.size() + 1) << 1);

  std::uniform_int_distribution<size_t> rdvtm(0, _workers.size()-1);

  do {
    t = (w._id == w._vtm) ? _wsq.steal() : _workers[w._vtm]._wsq.steal();

    if(t) {
      break;
    }

    if(num_steals++ > max_steals) {
      std::this_thread::yield();
      if(num_yields++ > 100) {
        break;
      }
    }

    w._vtm = rdvtm(w._rdgen);
  } while(!_done);

}